

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_function(CompilerGLSL *this,SPIRFunction *func,Bitset *return_flags)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variables_primary;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variables_secondary;
  uint32_t uVar1;
  StorageClass SVar2;
  size_t sVar3;
  ulong uVar4;
  TypedID<(spirv_cross::Types)2> *pTVar5;
  TypedID<(spirv_cross::Types)6> *pTVar6;
  bool bVar7;
  int iVar8;
  SPIRBlock *pSVar9;
  uint32_t *puVar10;
  SPIRFunction *pSVar11;
  mapped_type *pmVar12;
  SPIRConstant *c;
  SPIRType *pSVar13;
  SPIRVariable *pSVar14;
  TypedID<(spirv_cross::Types)2> *pTVar15;
  undefined8 uVar16;
  TypedID<(spirv_cross::Types)6> *pTVar17;
  ID *pIVar18;
  char (*in_R8) [12];
  long lVar19;
  Instruction *i;
  Instruction *instr;
  TypedID<(spirv_cross::Types)0> *pTVar20;
  _Any_data *p_Var21;
  long lVar22;
  string expr;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *dominated;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  SPIRBlock *local_90;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_88;
  long local_80;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *local_78;
  string local_70;
  string local_50;
  
  if (func->active == false) {
    func->active = true;
    sVar3 = (func->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
            buffer_size;
    if (sVar3 != 0) {
      pTVar17 = (func->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr;
      pTVar6 = pTVar17 + sVar3;
      do {
        pSVar9 = Variant::get<spirv_cross::SPIRBlock>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + pTVar17->id);
        sVar3 = (pSVar9->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
        if (sVar3 != 0) {
          instr = (pSVar9->ops).super_VectorView<spirv_cross::Instruction>.ptr;
          lVar19 = sVar3 * 0xc;
          do {
            puVar10 = Compiler::stream(&this->super_Compiler,instr);
            if (instr->op == 0x39) {
              pSVar11 = Variant::get<spirv_cross::SPIRFunction>
                                  ((this->super_Compiler).ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr + puVar10[2]);
              local_b0._M_dataplus._M_p._0_4_ = puVar10[1];
              pmVar12 = ::std::__detail::
                        _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&(this->super_Compiler).ir.meta,(key_type *)&local_b0);
              emit_function(this,pSVar11,&(pmVar12->decoration).decoration_flags);
            }
            instr = instr + 1;
            lVar19 = lVar19 + -0xc;
          } while (lVar19 != 0);
        }
        pTVar17 = pTVar17 + 1;
      } while (pTVar17 != pTVar6);
    }
    uVar1 = (func->entry_line).file_id;
    if (uVar1 != 0) {
      emit_line_directive(this,uVar1,(func->entry_line).line_literal);
    }
    (*(this->super_Compiler)._vptr_Compiler[7])(this,func,return_flags);
    statement<char_const(&)[2]>(this,(char (*) [2])0x2f5d0c);
    this->indent = this->indent + 1;
    if ((func->super_IVariant).self.id == (this->super_Compiler).ir.default_entry_point.id) {
      (*(this->super_Compiler)._vptr_Compiler[0x3d])(this);
    }
    (this->super_Compiler).current_function = func;
    local_90 = Variant::get<spirv_cross::SPIRBlock>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (func->entry_block).id);
    uVar4 = (func->constant_arrays_needed_on_stack).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (uVar4 != 0) {
      pTVar20 = (func->constant_arrays_needed_on_stack).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar19 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      ::std::
      __introsort_loop<spirv_cross::TypedID<(spirv_cross::Types)0>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pTVar20,pTVar20 + uVar4,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
      ::std::
      __final_insertion_sort<spirv_cross::TypedID<(spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_less_iter>
                (pTVar20,pTVar20 + uVar4);
    }
    sVar3 = (func->constant_arrays_needed_on_stack).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar3 != 0) {
      pTVar20 = (func->constant_arrays_needed_on_stack).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar19 = sVar3 << 2;
      do {
        c = Variant::get<spirv_cross::SPIRConstant>
                      ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                       pTVar20->id);
        pSVar13 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(c->super_IVariant).field_0xc);
        join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[12]>
                  (&local_50,(spirv_cross *)0x2f4e20,(char (*) [2])pTVar20,
                   (TypedID<(spirv_cross::Types)0> *)"_array_copy",in_R8);
        (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_b0,this,pSVar13);
        constant_expression_abi_cxx11_(&local_70,this,c,false,false);
        in_R8 = (char (*) [12])0x313c50;
        statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (this,&local_b0,(char (*) [4])0x308aad,&local_70,(char (*) [2])0x313c50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,(uint32_t)local_b0._M_dataplus._M_p) !=
            &local_b0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_b0._M_dataplus._M_p._4_4_,
                                   (uint32_t)local_b0._M_dataplus._M_p));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pTVar20 = pTVar20 + 1;
        lVar19 = lVar19 + -4;
      } while (lVar19 != 0);
    }
    sVar3 = (func->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
            buffer_size;
    if (sVar3 != 0) {
      pTVar5 = (func->local_variables).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
      variables_primary = &this->local_variable_names;
      variables_secondary = &this->block_names;
      local_88 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
      local_78 = &local_90->dominated_variables;
      lVar19 = sVar3 << 2;
      lVar22 = 0;
      local_80 = lVar19;
      do {
        pSVar14 = Variant::get<spirv_cross::SPIRVariable>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)((long)&pTVar5->id + lVar22));
        pSVar14->deferred_declaration = false;
        iVar8 = (*(this->super_Compiler)._vptr_Compiler[0x1c])(this,pSVar14,4);
        if ((char)iVar8 == '\0') {
          if (pSVar14->storage == StorageClassFunction) {
            if ((pSVar14->remapped_variable != true) || ((pSVar14->static_expression).id == 0))
            goto LAB_002502ae;
            goto LAB_002501ee;
          }
          if (pSVar14->storage == StorageClassPrivate) {
            local_b0._M_dataplus._M_p._0_4_ = (pSVar14->super_IVariant).self.id;
            pmVar12 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_88,(key_type *)&local_b0);
            add_variable(this,variables_primary,variables_secondary,(string *)pmVar12);
            pSVar9 = local_90;
            if ((pSVar14->initializer).id != 0) {
              (*(this->super_Compiler)._vptr_Compiler[0x27])(&local_b0,this,pSVar14);
              statement<std::__cxx11::string,char_const(&)[2]>
                        (this,&local_b0,(char (*) [2])0x313c50);
              goto LAB_002501da;
            }
            pIVar18 = &(pSVar14->super_IVariant).self;
            pTVar15 = (local_90->dominated_variables).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
            pTVar15 = ::std::
                      __find_if<spirv_cross::TypedID<(spirv_cross::Types)2>*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)0>const>>
                                (pTVar15,pTVar15 + (local_90->dominated_variables).
                                                                                                      
                                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
                                                  .buffer_size,pIVar18);
            sVar3 = (pSVar9->dominated_variables).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
            if (pTVar15 ==
                (pSVar9->dominated_variables).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr + sVar3) {
              uVar1 = pIVar18->id;
              SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
                        (local_78,sVar3 + 1);
              sVar3 = (local_90->dominated_variables).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
              (local_90->dominated_variables).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr[sVar3].id = uVar1;
              (local_90->dominated_variables).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size = sVar3 + 1
              ;
            }
            pSVar14->deferred_declaration = true;
            lVar19 = local_80;
          }
          else {
LAB_002502ae:
            bVar7 = Compiler::expression_is_lvalue
                              (&this->super_Compiler,*(uint32_t *)((long)&pTVar5->id + lVar22));
            if (bVar7) {
              local_b0._M_dataplus._M_p._0_4_ = (pSVar14->super_IVariant).self.id;
              pmVar12 = ::std::__detail::
                        _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](local_88,(key_type *)&local_b0);
              add_variable(this,variables_primary,variables_secondary,(string *)pmVar12);
              if (((pSVar14->initializer).id == 0) || (pSVar14->loop_variable != false)) {
                pSVar14->deferred_declaration = true;
              }
              else {
                SVar2 = pSVar14->storage;
                pSVar14->storage = StorageClassFunction;
                (*(this->super_Compiler)._vptr_Compiler[0x27])(&local_b0,this,pSVar14);
                pSVar14->storage = SVar2;
                statement<std::__cxx11::string,char_const(&)[2]>
                          (this,&local_b0,(char (*) [2])0x313c50);
                lVar19 = local_80;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,(uint32_t)local_b0._M_dataplus._M_p)
                    != &local_b0.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_b0._M_dataplus._M_p._4_4_,
                                           (uint32_t)local_b0._M_dataplus._M_p));
                }
              }
            }
            else {
              pSVar14->statically_assigned = true;
            }
          }
        }
        else {
          local_b0._M_dataplus._M_p._0_4_ = (pSVar14->super_IVariant).self.id;
          pmVar12 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_88,(key_type *)&local_b0);
          add_variable(this,variables_primary,variables_secondary,(string *)pmVar12);
          (*(this->super_Compiler)._vptr_Compiler[0x27])(&local_b0,this,pSVar14);
          statement<std::__cxx11::string,char_const(&)[2]>(this,&local_b0,(char (*) [2])0x313c50);
LAB_002501da:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,(uint32_t)local_b0._M_dataplus._M_p) !=
              &local_b0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_b0._M_dataplus._M_p._4_4_,
                                     (uint32_t)local_b0._M_dataplus._M_p));
          }
LAB_002501ee:
          pSVar14->deferred_declaration = false;
        }
        pSVar14->loop_variable_enable = false;
        if (pSVar14->loop_variable == true) {
          pSVar14->deferred_declaration = false;
          (pSVar14->static_expression).id = 0;
        }
        lVar22 = lVar22 + 4;
      } while (lVar19 != lVar22);
    }
    sVar3 = (func->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.
            buffer_size;
    if (sVar3 != 0) {
      pTVar6 = (func->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>.ptr;
      lVar19 = 0;
      do {
        pSVar9 = Variant::get<spirv_cross::SPIRBlock>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + *(uint *)((long)&pTVar6->id + lVar19));
        uVar4 = (pSVar9->dominated_variables).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
        if (uVar4 != 0) {
          pTVar5 = (pSVar9->dominated_variables).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
          lVar22 = 0x3f;
          if (uVar4 != 0) {
            for (; uVar4 >> lVar22 == 0; lVar22 = lVar22 + -1) {
            }
          }
          ::std::
          __introsort_loop<spirv_cross::TypedID<(spirv_cross::Types)2>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (pTVar5,pTVar5 + uVar4,((uint)lVar22 ^ 0x3f) * 2 ^ 0x7e);
          ::std::
          __final_insertion_sort<spirv_cross::TypedID<(spirv_cross::Types)2>*,__gnu_cxx::__ops::_Iter_less_iter>
                    (pTVar5,pTVar5 + uVar4);
        }
        lVar19 = lVar19 + 4;
      } while (sVar3 << 2 != lVar19);
    }
    pSVar11 = (this->super_Compiler).current_function;
    sVar3 = (pSVar11->fixup_hooks_in).super_VectorView<std::function<void_()>_>.buffer_size;
    if (sVar3 != 0) {
      p_Var21 = (_Any_data *)(pSVar11->fixup_hooks_in).super_VectorView<std::function<void_()>_>.ptr
      ;
      lVar19 = sVar3 << 5;
      do {
        if (*(long *)(p_Var21 + 1) == 0) {
          uVar16 = ::std::__throw_bad_function_call();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_b0._M_dataplus._M_p._4_4_,(uint32_t)local_b0._M_dataplus._M_p) !=
              &local_b0.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_b0._M_dataplus._M_p._4_4_,
                                     (uint32_t)local_b0._M_dataplus._M_p));
          }
          _Unwind_Resume(uVar16);
        }
        (**(code **)((long)p_Var21 + 0x18))(p_Var21);
        p_Var21 = p_Var21 + 2;
        lVar19 = lVar19 + -0x20;
      } while (lVar19 != 0);
    }
    emit_block_chain(this,local_90);
    end_scope(this);
    this->processing_entry_point = false;
    statement<char_const(&)[1]>(this,(char (*) [1])0x2f08f5);
    sVar3 = (func->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
            buffer_size;
    if (sVar3 != 0) {
      pTVar5 = (func->local_variables).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
      lVar19 = 0;
      do {
        pSVar14 = Variant::get<spirv_cross::SPIRVariable>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)((long)&pTVar5->id + lVar19));
        pSVar14->deferred_declaration = false;
        lVar19 = lVar19 + 4;
      } while (sVar3 << 2 != lVar19);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_function(SPIRFunction &func, const Bitset &return_flags)
{
	// Avoid potential cycles.
	if (func.active)
		return;
	func.active = true;

	// If we depend on a function, emit that function before we emit our own function.
	for (auto block : func.blocks)
	{
		auto &b = get<SPIRBlock>(block);
		for (auto &i : b.ops)
		{
			auto ops = stream(i);
			auto op = static_cast<Op>(i.op);

			if (op == OpFunctionCall)
			{
				// Recursively emit functions which are called.
				uint32_t id = ops[2];
				emit_function(get<SPIRFunction>(id), ir.meta[ops[1]].decoration.decoration_flags);
			}
		}
	}

	if (func.entry_line.file_id != 0)
		emit_line_directive(func.entry_line.file_id, func.entry_line.line_literal);
	emit_function_prototype(func, return_flags);
	begin_scope();

	if (func.self == ir.default_entry_point)
		emit_entry_point_declarations();

	current_function = &func;
	auto &entry_block = get<SPIRBlock>(func.entry_block);

	sort(begin(func.constant_arrays_needed_on_stack), end(func.constant_arrays_needed_on_stack));
	for (auto &array : func.constant_arrays_needed_on_stack)
	{
		auto &c = get<SPIRConstant>(array);
		auto &type = get<SPIRType>(c.constant_type);
		statement(variable_decl(type, join("_", array, "_array_copy")), " = ", constant_expression(c), ";");
	}

	for (auto &v : func.local_variables)
	{
		auto &var = get<SPIRVariable>(v);
		var.deferred_declaration = false;

		if (variable_decl_is_remapped_storage(var, StorageClassWorkgroup))
		{
			// Special variable type which cannot have initializer,
			// need to be declared as standalone variables.
			// Comes from MSL which can push global variables as local variables in main function.
			add_local_variable_name(var.self);
			statement(variable_decl(var), ";");
			var.deferred_declaration = false;
		}
		else if (var.storage == StorageClassPrivate)
		{
			// These variables will not have had their CFG usage analyzed, so move it to the entry block.
			// Comes from MSL which can push global variables as local variables in main function.
			// We could just declare them right now, but we would miss out on an important initialization case which is
			// LUT declaration in MSL.
			// If we don't declare the variable when it is assigned we're forced to go through a helper function
			// which copies elements one by one.
			add_local_variable_name(var.self);

			if (var.initializer)
			{
				statement(variable_decl(var), ";");
				var.deferred_declaration = false;
			}
			else
			{
				auto &dominated = entry_block.dominated_variables;
				if (find(begin(dominated), end(dominated), var.self) == end(dominated))
					entry_block.dominated_variables.push_back(var.self);
				var.deferred_declaration = true;
			}
		}
		else if (var.storage == StorageClassFunction && var.remapped_variable && var.static_expression)
		{
			// No need to declare this variable, it has a static expression.
			var.deferred_declaration = false;
		}
		else if (expression_is_lvalue(v))
		{
			add_local_variable_name(var.self);

			// Loop variables should never be declared early, they are explicitly emitted in a loop.
			if (var.initializer && !var.loop_variable)
				statement(variable_decl_function_local(var), ";");
			else
			{
				// Don't declare variable until first use to declutter the GLSL output quite a lot.
				// If we don't touch the variable before first branch,
				// declare it then since we need variable declaration to be in top scope.
				var.deferred_declaration = true;
			}
		}
		else
		{
			// HACK: SPIR-V in older glslang output likes to use samplers and images as local variables, but GLSL does not allow this.
			// For these types (non-lvalue), we enforce forwarding through a shadowed variable.
			// This means that when we OpStore to these variables, we just write in the expression ID directly.
			// This breaks any kind of branching, since the variable must be statically assigned.
			// Branching on samplers and images would be pretty much impossible to fake in GLSL.
			var.statically_assigned = true;
		}

		var.loop_variable_enable = false;

		// Loop variables are never declared outside their for-loop, so block any implicit declaration.
		if (var.loop_variable)
		{
			var.deferred_declaration = false;
			// Need to reset the static expression so we can fallback to initializer if need be.
			var.static_expression = 0;
		}
	}

	// Enforce declaration order for regression testing purposes.
	for (auto &block_id : func.blocks)
	{
		auto &block = get<SPIRBlock>(block_id);
		sort(begin(block.dominated_variables), end(block.dominated_variables));
	}

	for (auto &line : current_function->fixup_hooks_in)
		line();

	emit_block_chain(entry_block);

	end_scope();
	processing_entry_point = false;
	statement("");

	// Make sure deferred declaration state for local variables is cleared when we are done with function.
	// We risk declaring Private/Workgroup variables in places we are not supposed to otherwise.
	for (auto &v : func.local_variables)
	{
		auto &var = get<SPIRVariable>(v);
		var.deferred_declaration = false;
	}
}